

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

int luv_getnameinfo(lua_State *L)

{
  int iVar1;
  int status;
  lua_Integer lVar2;
  char *string;
  luv_req_t *plVar3;
  uv_loop_t *loop;
  uv_getnameinfo_cb getnameinfo_cb;
  int local_b8;
  int port;
  int ref;
  int ret;
  int flags;
  char *ip;
  sockaddr_storage addr;
  uv_getnameinfo_t *req;
  lua_State *L_local;
  
  _ret = (char *)0x0;
  local_b8 = 0;
  luaL_checktype(L,1,5);
  memset(&ip,0,0x80);
  lua_getfield(L,1,"ip");
  iVar1 = lua_isstring(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      luaL_argerror(L,1,"ip property must be string if set");
    }
  }
  else {
    _ret = lua_tolstring(L,-1,(size_t *)0x0);
  }
  lua_settop(L,-2);
  lua_getfield(L,1,"port");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      luaL_argerror(L,1,"port property must be integer if set");
    }
  }
  else {
    lVar2 = lua_tointegerx(L,-1,(int *)0x0);
    local_b8 = (int)lVar2;
  }
  lua_settop(L,-2);
  if ((_ret != (char *)0x0) || (local_b8 != 0)) {
    if (_ret == (char *)0x0) {
      _ret = "0.0.0.0";
    }
    iVar1 = uv_ip4_addr(_ret,local_b8,(sockaddr_in *)&ip);
    if (iVar1 == 0) {
      ip._0_2_ = 2;
    }
    else {
      iVar1 = uv_ip6_addr(_ret,local_b8,(sockaddr_in6 *)&ip);
      if (iVar1 != 0) {
        iVar1 = luaL_argerror(L,1,"Invalid ip address or port");
        return iVar1;
      }
      ip._0_2_ = 10;
    }
  }
  lua_getfield(L,1,"family");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luaL_argerror(L,1,"family must be string if set");
      }
    }
    else {
      string = lua_tolstring(L,-1,(size_t *)0x0);
      iVar1 = luv_af_string_to_num(string);
      ip._0_2_ = (undefined2)iVar1;
    }
  }
  else {
    lVar2 = lua_tointegerx(L,-1,(int *)0x0);
    ip._0_2_ = (undefined2)lVar2;
  }
  lua_settop(L,-2);
  iVar1 = luv_check_continuation(L,2);
  addr.__ss_align = (unsigned_long)lua_newuserdata(L,0x528);
  plVar3 = luv_setup_req(L,iVar1);
  *(luv_req_t **)addr.__ss_align = plVar3;
  loop = luv_loop(L);
  getnameinfo_cb = luv_getnameinfo_cb;
  if (iVar1 == -2) {
    getnameinfo_cb = (uv_getnameinfo_cb)0x0;
  }
  status = uv_getnameinfo(loop,(uv_getnameinfo_t *)addr.__ss_align,getnameinfo_cb,(sockaddr *)&ip,0)
  ;
  if (status < 0) {
    luv_cleanup_req(L,*(luv_req_t **)addr.__ss_align);
    lua_settop(L,-2);
    L_local._4_4_ = luv_error(L,status);
  }
  else if (iVar1 == -2) {
    lua_settop(L,-2);
    lua_pushstring(L,(char *)(addr.__ss_align + 0xfc));
    lua_pushstring(L,(char *)(addr.__ss_align + 0x4fd));
    luv_cleanup_req(L,*(luv_req_t **)addr.__ss_align);
    L_local._4_4_ = 2;
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_getnameinfo(lua_State* L) {
  uv_getnameinfo_t* req;
  struct sockaddr_storage addr;
  const char* ip = NULL;
  int flags = 0;
  int ret, ref, port = 0;
  luv_ctx_t* ctx = luv_context(L);

  luaL_checktype(L, 1, LUA_TTABLE);
  memset(&addr, 0, sizeof(addr));

  lua_getfield(L, 1, "ip");
  if (lua_isstring(L, -1)) {
    ip = lua_tostring(L, -1);
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "ip property must be string if set");
  }
  lua_pop(L, 1);

  lua_getfield(L, 1, "port");
  if (lua_isnumber(L, -1)) {
    port = lua_tointeger(L, -1);
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "port property must be integer if set");
  }
  lua_pop(L, 1);

  if (ip || port) {
    if (!ip) ip = "0.0.0.0";
    if (!uv_ip4_addr(ip, port, (struct sockaddr_in*)&addr)) {
      addr.ss_family = AF_INET;
    }
    else if (!uv_ip6_addr(ip, port, (struct sockaddr_in6*)&addr)) {
      addr.ss_family = AF_INET6;
    }
    else {
      return luaL_argerror(L, 1, "Invalid ip address or port");
    }
  }

  lua_getfield(L, 1, "family");
  if (lua_isnumber(L, -1)) {
    addr.ss_family = lua_tointeger(L, -1);
  }
  else if (lua_isstring(L, -1)) {
    addr.ss_family = luv_af_string_to_num(lua_tostring(L, -1));
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "family must be string if set");
  }
  lua_pop(L, 1);

  ref = luv_check_continuation(L, 2);

  req = (uv_getnameinfo_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  ret = uv_getnameinfo(ctx->loop, req, ref == LUA_NOREF ? NULL : luv_getnameinfo_cb, (struct sockaddr*)&addr, flags);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  if (ref == LUA_NOREF) {
    lua_pop(L, 1);
    lua_pushstring(L, req->host);
    lua_pushstring(L, req->service);
    luv_cleanup_req(L, (luv_req_t*)req->data);
    return 2;
  }
  return 1;
}